

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToFirst(DBIter *this)

{
  ulong uVar1;
  long in_RDI;
  string *in_stack_00000030;
  bool in_stack_0000003f;
  DBIter *in_stack_00000040;
  
  *(undefined4 *)(in_RDI + 0x90) = 0;
  ClearSavedValue(this);
  (**(code **)(**(long **)(in_RDI + 0x38) + 0x18))();
  uVar1 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
  if ((uVar1 & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x94) = 0;
  }
  else {
    FindNextUserEntry(in_stack_00000040,in_stack_0000003f,in_stack_00000030);
  }
  return;
}

Assistant:

void DBIter::SeekToFirst() {
  direction_ = kForward;
  ClearSavedValue();
  iter_->SeekToFirst();
  if (iter_->Valid()) {
    FindNextUserEntry(false, &saved_key_ /* temporary storage */);
  } else {
    valid_ = false;
  }
}